

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall toml::type_error::~type_error(type_error *this)

{
  type_error *in_RDI;
  
  ~type_error(in_RDI);
  operator_delete(in_RDI,0xa0);
  return;
}

Assistant:

~type_error() noexcept override = default;